

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfiledialog.cpp
# Opt level: O2

int __thiscall QFileDialog::qt_metacall(QFileDialog *this,Call _c,int _id,void **_a)

{
  uint _id_00;
  Call _c_00;
  
  _id_00 = QDialog::qt_metacall(&this->super_QDialog,_c,_id,_a);
  if ((int)_id_00 < 0) {
    return _id_00;
  }
  if (BindableProperty < _c) {
    return _id_00;
  }
  if ((0x14eU >> (_c & 0x1f) & 1) != 0) {
    qt_static_metacall((QObject *)this,_c,_id_00,_a);
    return _id_00 - 6;
  }
  if (_c == InvokeMetaMethod) {
    if (8 < _id_00) goto LAB_004a33d5;
    _c_00 = InvokeMetaMethod;
  }
  else {
    if (_c != RegisterMethodArgumentMetaType) {
      return _id_00;
    }
    if (8 < _id_00) goto LAB_004a33d5;
    _c_00 = RegisterMethodArgumentMetaType;
  }
  qt_static_metacall((QObject *)this,_c_00,_id_00,_a);
LAB_004a33d5:
  return _id_00 - 9;
}

Assistant:

int QFileDialog::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QDialog::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 9)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 9;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 9)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 9;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 6;
    }
    return _id;
}